

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_3<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_3<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>_>
         *this)

{
  EVP_PKEY_CTX *ctx;
  CATCH2_INTERNAL_TEMPLATE_TEST_3<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
  obj;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_90 [2];
  SmallVectorBase<(anonymous_namespace)::Constructable> local_50 [2];
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_90[0].data_ = (pointer)local_90[0].firstElement;
  local_90[0].len = 0;
  ctx = (EVP_PKEY_CTX *)0x5;
  local_90[0].cap = 5;
  local_50[0].data_ = (pointer)local_50[0].firstElement;
  local_50[0].len = 0;
  local_50[0].cap = 5;
  (*(code *)this->m_testAsMethod)(local_90[0].firstElement + *(long *)&this->field_0x10 + -0x18);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(local_50,ctx);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(local_90,ctx);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }